

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

UBool ucal_getTimeZoneTransitionDate_63
                (UCalendar *cal,UTimeZoneTransitionType type,UDate *transition,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  TimeZone *pTVar3;
  UDate UVar4;
  char local_93;
  bool local_91;
  TimeZoneRule *local_90;
  undefined1 local_68 [6];
  UBool result;
  UBool inclusive;
  TimeZoneTransition tzt;
  BasicTimeZone *btz;
  TimeZone *tz;
  UDate base;
  UErrorCode *status_local;
  UDate *transition_local;
  UTimeZoneTransitionType type_local;
  UCalendar *cal_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar4 = icu_63::Calendar::getTime((Calendar *)cal,status);
    pTVar3 = icu_63::Calendar::getTimeZone((Calendar *)cal);
    if (pTVar3 == (TimeZone *)0x0) {
      local_90 = (TimeZoneRule *)0x0;
    }
    else {
      local_90 = (TimeZoneRule *)
                 __dynamic_cast(pTVar3,&icu_63::TimeZone::typeinfo,&icu_63::BasicTimeZone::typeinfo,
                                0);
    }
    tzt.fTo = local_90;
    if ((local_90 != (TimeZoneRule *)0x0) && (UVar1 = U_SUCCESS(*status), UVar1 != '\0')) {
      icu_63::TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_68);
      local_91 = type == UCAL_TZ_TRANSITION_NEXT_INCLUSIVE ||
                 type == UCAL_TZ_TRANSITION_PREVIOUS_INCLUSIVE;
      if ((type == UCAL_TZ_TRANSITION_NEXT) || (type == UCAL_TZ_TRANSITION_NEXT_INCLUSIVE)) {
        iVar2 = (*((tzt.fTo)->super_UObject)._vptr_UObject[0xe])
                          (UVar4,tzt.fTo,(ulong)(uint)(int)local_91,local_68);
        local_93 = (char)iVar2;
      }
      else {
        iVar2 = (*((tzt.fTo)->super_UObject)._vptr_UObject[0xf])
                          (UVar4,tzt.fTo,(ulong)(uint)(int)local_91,local_68);
        local_93 = (char)iVar2;
      }
      if (local_93 != '\0') {
        UVar4 = icu_63::TimeZoneTransition::getTime((TimeZoneTransition *)local_68);
        *transition = UVar4;
        cal_local._7_1_ = '\x01';
      }
      icu_63::TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_68);
      if (local_93 != '\0') {
        return cal_local._7_1_;
      }
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2 
ucal_getTimeZoneTransitionDate(const UCalendar* cal, UTimeZoneTransitionType type,
                               UDate* transition, UErrorCode* status)
{
    if (U_FAILURE(*status)) {
        return FALSE;
    }
    UDate base = ((Calendar*)cal)->getTime(*status);
    const TimeZone& tz = ((Calendar*)cal)->getTimeZone();
    const BasicTimeZone * btz = dynamic_cast<const BasicTimeZone *>(&tz);
    if (btz != NULL && U_SUCCESS(*status)) {
        TimeZoneTransition tzt;
        UBool inclusive = (type == UCAL_TZ_TRANSITION_NEXT_INCLUSIVE || type == UCAL_TZ_TRANSITION_PREVIOUS_INCLUSIVE);
        UBool result = (type == UCAL_TZ_TRANSITION_NEXT || type == UCAL_TZ_TRANSITION_NEXT_INCLUSIVE)?
                        btz->getNextTransition(base, inclusive, tzt):
                        btz->getPreviousTransition(base, inclusive, tzt);
        if (result) {
            *transition = tzt.getTime();
            return TRUE;
        }
    }
    return FALSE;
}